

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2_test.cc
# Opt level: O0

void re2::FilteredRE2TestMatchEmptyPattern(void)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  LogMessage local_440;
  StringPiece local_2c0;
  undefined1 local_2b0 [8];
  vector<int,_std::allocator<int>_> matching_regexps;
  vector<int,_std::allocator<int>_> atom_ids;
  string local_278 [8];
  string text;
  int local_254;
  undefined1 local_250 [4];
  int nregexp;
  allocator local_b9;
  string local_b8 [32];
  undefined **local_98;
  AtomTest *t;
  FilterTestVars v;
  
  FLAGS_filtered_re2_min_atom_len = 3;
  FilterTestVars::FilterTestVars((FilterTestVars *)&t);
  puVar1 = atom_tests;
  local_98 = &atom_tests;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,puVar1,&local_b9);
  bVar2 = std::operator==("CheckEmptyPattern",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
               ,0xd6);
    poVar4 = LogMessage::stream((LogMessage *)local_250);
    std::operator<<(poVar4,"Check failed: (\"CheckEmptyPattern\") == (string(t->testname))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_250);
  }
  local_254 = 0;
  while ((local_254 < 0x14 && (local_98[(long)local_254 + 1] != (undefined *)0x0))) {
    local_254 = local_254 + 1;
  }
  AddRegexpsAndCompile(local_98 + 1,local_254,(FilterTestVars *)&t);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"0123",
             (allocator *)
             ((long)&atom_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&atom_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_2b0);
  StringPiece::StringPiece(&local_2c0,(string *)local_278);
  iVar3 = FilteredRE2::FirstMatch
                    ((FilteredRE2 *)&v.opts.literal_,&local_2c0,
                     (vector<int,_std::allocator<int>_> *)
                     &matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (iVar3 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
               ,0xdf);
    poVar4 = LogMessage::stream(&local_440);
    std::operator<<(poVar4,"Check failed: (0) == (v.f.FirstMatch(text, atom_ids))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_440);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2b0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_278);
  FilterTestVars::~FilterTestVars((FilterTestVars *)&t);
  return;
}

Assistant:

TEST(FilteredRE2Test, MatchEmptyPattern) {
  FLAGS_filtered_re2_min_atom_len = 3;

  FilterTestVars v;
  AtomTest* t = &atom_tests[0];
  // We are using the regexps used in one of the atom tests
  // for this test. Adding the EXPECT here to make sure
  // the index we use for the test is for the correct test.
  EXPECT_EQ("CheckEmptyPattern", string(t->testname));
  int nregexp;
  for (nregexp = 0; nregexp < arraysize(t->regexps); nregexp++)
    if (t->regexps[nregexp] == NULL)
      break;
  AddRegexpsAndCompile(t->regexps, nregexp, &v);
  string text = "0123";
  vector<int> atom_ids;
  vector<int> matching_regexps;
  EXPECT_EQ(0, v.f.FirstMatch(text, atom_ids));
}